

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TZDBTimeZoneNames::getMetaZoneDisplayName
          (TZDBTimeZoneNames *this,UnicodeString *mzID,UTimeZoneNameType type,UnicodeString *name)

{
  TZDBTimeZoneNames *this_00;
  UBool UVar1;
  ConstChar16Ptr local_50;
  UChar *local_48;
  UChar *s;
  TZDBNames *tzdbNames;
  TZDBTimeZoneNames *pTStack_30;
  UErrorCode status;
  UnicodeString *name_local;
  UnicodeString *pUStack_20;
  UTimeZoneNameType type_local;
  UnicodeString *mzID_local;
  TZDBTimeZoneNames *this_local;
  
  pTStack_30 = (TZDBTimeZoneNames *)name;
  name_local._4_4_ = type;
  pUStack_20 = mzID;
  mzID_local = (UnicodeString *)this;
  UnicodeString::setToBogus(name);
  UVar1 = UnicodeString::isEmpty(pUStack_20);
  if (UVar1 == '\0') {
    tzdbNames._4_4_ = U_ZERO_ERROR;
    s = (UChar *)getMetaZoneNames(pUStack_20,(UErrorCode *)((long)&tzdbNames + 4));
    UVar1 = ::U_SUCCESS(tzdbNames._4_4_);
    if (((UVar1 != '\0') && (s != (UChar *)0x0)) &&
       (local_48 = TZDBNames::getName((TZDBNames *)s,name_local._4_4_), this_00 = pTStack_30,
       local_48 != (UChar *)0x0)) {
      ConstChar16Ptr::ConstChar16Ptr(&local_50,local_48);
      UnicodeString::setTo((UnicodeString *)this_00,'\x01',&local_50,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_50);
    }
    this_local = pTStack_30;
  }
  else {
    this_local = pTStack_30;
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
TZDBTimeZoneNames::getMetaZoneDisplayName(const UnicodeString& mzID,
                                          UTimeZoneNameType type,
                                          UnicodeString& name) const {
    name.setToBogus();
    if (mzID.isEmpty()) {
        return name;
    }

    UErrorCode status = U_ZERO_ERROR;
    const TZDBNames *tzdbNames = TZDBTimeZoneNames::getMetaZoneNames(mzID, status);
    if (U_SUCCESS(status)) {
        if (tzdbNames != NULL) {
            const UChar *s = tzdbNames->getName(type);
            if (s != NULL) {
                name.setTo(TRUE, s, -1);
            }
        }
    }

    return name;
}